

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFadds.c
# Opt level: O2

void Gia_ManDupWithFaddBoxes_rec
               (Gia_Man_t *pNew,Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vFadds,Vec_Int_t *vMap,
               Vec_Wec_t *vChains,Vec_Int_t *vMap2Chain,Vec_Int_t *vTruths)

{
  int iVar1;
  int iLit1;
  uint uVar2;
  
  if (pObj->Value == 0xffffffff) {
    if (((int)(uint)*(undefined8 *)pObj < 0) ||
       (((uint)*(undefined8 *)pObj & 0x1fffffff) == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaFadds.c"
                    ,0x27c,
                    "void Gia_ManDupWithFaddBoxes_rec(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    iVar1 = Gia_ObjId(p,pObj);
    Vec_IntEntry(vMap2Chain,iVar1);
    Gia_ManDupWithFaddBoxes_rec
              (pNew,p,pObj + -(*(ulong *)pObj & 0x1fffffff),vFadds,vMap,vChains,vMap2Chain,vTruths);
    Gia_ManDupWithFaddBoxes_rec
              (pNew,p,pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff),vFadds,vMap,vChains,
               vMap2Chain,vTruths);
    iVar1 = Gia_ObjFanin0Copy(pObj);
    iLit1 = Gia_ObjFanin1Copy(pObj);
    uVar2 = Gia_ManAppendAnd(pNew,iVar1,iLit1);
    pObj->Value = uVar2;
  }
  return;
}

Assistant:

void Gia_ManDupWithFaddBoxes_rec( Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vFadds, Vec_Int_t * vMap, Vec_Wec_t * vChains, Vec_Int_t * vMap2Chain, Vec_Int_t * vTruths )
{
    int iChain;
    if ( ~pObj->Value )
        return;
    assert( Gia_ObjIsAnd(pObj) );
    iChain = Vec_IntEntry( vMap2Chain, Gia_ObjId(p, pObj) );
/*
    assert( iChain == -1 );
    if ( iChain >= 0 )
    {
        Gia_ManDupFadd( pNew, p, Vec_WecEntry(vChains, iChain), vFadds, vMap, vChains, vMap2Chain, vTruths );
        assert( ~pObj->Value );
        return;
    }
*/
    Gia_ManDupWithFaddBoxes_rec( pNew, p, Gia_ObjFanin0(pObj), vFadds, vMap, vChains, vMap2Chain, vTruths );
    Gia_ManDupWithFaddBoxes_rec( pNew, p, Gia_ObjFanin1(pObj), vFadds, vMap, vChains, vMap2Chain, vTruths );
    pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
}